

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chardev.c
# Opt level: O1

LispPTR CHAR_ioctl(LispPTR *args)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  DLword *pDVar6;
  uint uVar7;
  
  uVar7 = args[3];
  if ((uVar7 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar7);
  }
  Lisp_errno = (int *)(Lisp_world + uVar7);
  uVar7 = *args;
  if ((uVar7 & 0xfff0000) == 0xf0000) {
    uVar7 = uVar7 | 0xffff0000;
  }
  else if ((uVar7 & 0xfff0000) == 0xe0000) {
    uVar7 = uVar7 & 0xffff;
  }
  else {
    if ((uVar7 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar7);
    }
    uVar7 = *(uint *)(Lisp_world + uVar7);
  }
  uVar2 = args[1];
  if ((uVar2 & 0xfff0000) == 0xf0000) {
    uVar2 = uVar2 | 0xffff0000;
  }
  else if ((uVar2 & 0xfff0000) == 0xe0000) {
    uVar2 = uVar2 & 0xffff;
  }
  else {
    if ((uVar2 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
    }
    uVar2 = *(uint *)(Lisp_world + uVar2);
  }
  uVar1 = args[2];
  if ((uVar1 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar1);
  }
  pDVar6 = Lisp_world + uVar1;
  iVar3 = _setjmp((__jmp_buf_tag *)jmpbuf);
  iVar4 = 100;
  if (iVar3 == 0) {
    alarm(TIMEOUT_TIME);
    piVar5 = __errno_location();
    do {
      *piVar5 = 0;
      iVar4 = ioctl(uVar7,(long)(int)uVar2,pDVar6);
      if (iVar4 != -1) break;
    } while (*piVar5 == 4);
    alarm(0);
    if (iVar4 == 0) {
      return 0x4c;
    }
    err_mess("ioctl",*piVar5);
    iVar4 = *piVar5;
  }
  *Lisp_errno = iVar4;
  return 0;
}

Assistant:

LispPTR CHAR_ioctl(LispPTR *args)
{
#ifndef DOS
  int fd, request;
  void *data;
  int rval;
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[3]);
  fd = LispNumToCInt(args[0]);
  request = LispNumToCInt(args[1]);
  data = NativeAligned4FromLAddr(args[2]);
  ERRSETJMP(NIL);
  TIMEOUT(rval = ioctl(fd, request, data));
  if (rval != 0) {
    err_mess("ioctl", errno);
    *Lisp_errno = errno;
    return (NIL);
  }
  return (ATOM_T);
#endif /* DOS */
}